

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# milo.c
# Opt level: O2

void * milo_context_push(milo_context *c,size_t size)

{
  char *pcVar1;
  size_t sVar2;
  ulong __size;
  ulong uVar3;
  
  if (size != 0) {
    __size = c->size;
    sVar2 = c->top;
    uVar3 = sVar2 + size;
    if (uVar3 < __size) {
      pcVar1 = c->stack;
    }
    else {
      if (__size != 0) goto LAB_0010c276;
      __size = 0x100;
      while( true ) {
        c->size = __size;
LAB_0010c276:
        if (uVar3 < __size) break;
        __size = __size + (__size >> 1);
      }
      pcVar1 = (char *)realloc(c->stack,__size);
      c->stack = pcVar1;
      sVar2 = c->top;
      uVar3 = size + sVar2;
    }
    c->top = uVar3;
    return pcVar1 + sVar2;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/milo.c",
                0x1f,"void *milo_context_push(milo_context *, size_t)");
}

Assistant:

static void* milo_context_push(milo_context* c, size_t size) {
    void* ret;
    assert(size > 0);
    if (c->top + size >= c->size) {
        if (c->size == 0)
            c->size = MILO_PARSE_STACK_INIT_SIZE;
        while (c->top + size >= c->size)
            c->size += c->size >> 1; /* c->size * 1.5 */
        c->stack = (char*) realloc(c->stack, c->size);
    }
    ret = c->stack + c->top;
    c->top += size;
    return ret;
}